

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::DateTest_test_valid_date_to_string_Test::TestBody
          (DateTest_test_valid_date_to_string_Test *this)

{
  Date *pDVar1;
  char *pcVar2;
  AssertHelper AStack_48;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [4];
  
  pDVar1 = (Date *)operator_new(0xc);
  bidfx_public_api::tools::Date::Date(pDVar1,0x7e2,10,10);
  bidfx_public_api::tools::Date::ToString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"date1->ToString().c_str()","\"20181010\"",
             (char *)local_30[0].ptr_,"20181010");
  std::__cxx11::string::~string((string *)local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/date_test.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_30);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    pDVar1 = (Date *)operator_new(0xc);
    bidfx_public_api::tools::Date::Date(pDVar1,0x7e2,9,5);
    bidfx_public_api::tools::Date::ToString_abi_cxx11_();
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"date2->ToString().c_str()","\"20180905\"",
               (char *)local_30[0].ptr_,"20180905");
    std::__cxx11::string::~string((string *)local_30);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)local_30);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/date_test.cpp"
                 ,0x1a,pcVar2);
      testing::internal::AssertHelper::operator=(&AStack_48,(Message *)local_30);
      testing::internal::AssertHelper::~AssertHelper(&AStack_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(local_30);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(DateTest, test_valid_date_to_string) {
    Date* date1 = new Date(2018, 10, 10);
    ASSERT_STREQ(date1->ToString().c_str(), "20181010");

    Date* date2 = new Date(2018, 9, 5);
    ASSERT_STREQ(date2->ToString().c_str(), "20180905");
}